

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

int testUTF8(int param_1,char **param_2)

{
  bool bVar1;
  test_utf8_char local_90;
  char **local_80;
  char **s_1;
  char **local_68;
  char **s;
  char *local_58;
  size_t local_50;
  char *local_48;
  test_utf8_char *local_40;
  test_utf8_char *c;
  char *local_30;
  test_utf8_entry *local_28;
  test_utf8_entry *e;
  char **ppcStack_18;
  int result;
  char **param_1_local;
  int param_0_local;
  
  e._4_4_ = 0;
  local_28 = good_entry;
  ppcStack_18 = param_2;
  param_1_local._4_4_ = param_1;
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_28->str);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = decode_good(local_28);
    if (!bVar1) {
      e._4_4_ = 1;
    }
    c = (test_utf8_char *)(local_28->str)._M_len;
    local_30 = (local_28->str)._M_str;
    bVar1 = is_valid(local_28->str);
    if (!bVar1) {
      e._4_4_ = 1;
    }
    local_28 = local_28 + 1;
  }
  local_40 = bad_chars;
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = local_40->_M_len;
    local_48 = local_40->_M_str;
    bVar1 = decode_bad(*local_40);
    if (!bVar1) {
      e._4_4_ = 1;
    }
    s = (char **)local_40->_M_len;
    local_58 = local_40->_M_str;
    bVar1 = is_invalid(*local_40);
    if (!bVar1) {
      e._4_4_ = 1;
    }
    local_40 = local_40 + 1;
  }
  for (local_68 = good_strings; *local_68 != (char *)0x0; local_68 = local_68 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&s_1,*local_68);
    bVar1 = is_valid(_s_1);
    if (!bVar1) {
      e._4_4_ = 1;
    }
  }
  for (local_80 = bad_strings; *local_80 != (char *)0x0; local_80 = local_80 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,*local_80);
    bVar1 = is_invalid(local_90);
    if (!bVar1) {
      e._4_4_ = 1;
    }
  }
  return e._4_4_;
}

Assistant:

int testUTF8(int /*unused*/, char* /*unused*/[])
{
  int result = 0;
  for (test_utf8_entry const* e = good_entry; !e->str.empty(); ++e) {
    if (!decode_good(*e)) {
      result = 1;
    }
    if (!is_valid(e->str)) {
      result = 1;
    }
  }
  for (test_utf8_char* c = bad_chars; !(*c).empty(); ++c) {
    if (!decode_bad(*c)) {
      result = 1;
    }
    if (!is_invalid(*c)) {
      result = 1;
    }
  }
  for (char const** s = good_strings; *s; ++s) {
    if (!is_valid(*s)) {
      result = 1;
    }
  }
  for (char const** s = bad_strings; *s; ++s) {
    if (!is_invalid(*s)) {
      result = 1;
    }
  }
  return result;
}